

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

ExecutionMode __thiscall
Js::FunctionExecutionStateMachine::StateToMode
          (FunctionExecutionStateMachine *this,ExecutionState state)

{
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (state < (FullJit|AutoProfilingInterpreter0)) {
    EVar2 = (ExecutionMode)(0x4020301020100 >> ((state & (FullJit|AutoProfilingInterpreter0)) << 3))
    ;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x1da,"(!\"Unexpected ExecutionState for ExecutionMode\")",
                                "!\"Unexpected ExecutionState for ExecutionMode\"");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    EVar2 = Interpreter;
  }
  return EVar2;
}

Assistant:

ExecutionMode  FunctionExecutionStateMachine::StateToMode(ExecutionState state) const
    {
        switch (state)
        {
        case ExecutionState::AutoProfilingInterpreter0:
        case ExecutionState::AutoProfilingInterpreter1:
            return ExecutionMode::AutoProfilingInterpreter;

        case ExecutionState::ProfilingInterpreter0:
        case ExecutionState::ProfilingInterpreter1:
            return ExecutionMode::ProfilingInterpreter;

        case ExecutionState::SimpleJit:
            return ExecutionMode::SimpleJit;

        case ExecutionState::FullJit:
            return ExecutionMode::FullJit;

        default:
            Assert(!"Unexpected ExecutionState for ExecutionMode");
            // fall through
        case ExecutionState::Interpreter:
            return ExecutionMode::Interpreter;
        }
    }